

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_2> *
gl4cts::Math::outerProduct<2,2>(Vector<double,_2> *left,Vector<double,_2> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Matrix<double,_2,_2> *result;
  Matrix<double,_2,_2> *in_RDI;
  
  dVar1 = right->m_data[0];
  dVar2 = right->m_data[1];
  dVar3 = left->m_data[0];
  dVar4 = left->m_data[1];
  (in_RDI->m_data).m_data[0].m_data[0] = dVar1 * dVar3 + 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = dVar1 * dVar4 + 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = dVar2 * dVar3 + 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = dVar2 * dVar4 + 0.0;
  return in_RDI;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}